

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * __thiscall
phosg::vformat_color_escape_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,TerminalFormat color,__va_list_tag *va)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  puVar5 = (uint *)CONCAT44(in_register_00000014,color);
  uVar4 = (ulong)this & 0xffffffff;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\x1b","");
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               ((__return_storage_ptr__->_M_dataplus)._M_p
                [__return_storage_ptr__->_M_string_length - 1] == '\x1b') * ' ' + ';');
    uVar7 = (uint)uVar4;
    uVar6 = -uVar7;
    if (0 < (int)uVar7) {
      uVar6 = uVar7;
    }
    __len = 1;
    if (9 < uVar6) {
      uVar4 = (ulong)uVar6;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar2 = (uint)uVar4;
        if (uVar2 < 100) {
          __len = __len - 2;
          goto LAB_0010f00f;
        }
        if (uVar2 < 1000) {
          __len = __len - 1;
          goto LAB_0010f00f;
        }
        if (uVar2 < 10000) goto LAB_0010f00f;
        uVar4 = uVar4 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar2);
      __len = __len + 1;
    }
LAB_0010f00f:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,(ulong)(-((int)uVar7 >> 0x1f) + __len),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_58._M_dataplus._M_p + (uint)-((int)uVar7 >> 0x1f),__len,uVar6);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    uVar6 = *puVar5;
    if ((ulong)uVar6 < 0x29) {
      puVar3 = (uint *)((ulong)uVar6 + *(long *)(puVar5 + 4));
      *puVar5 = uVar6 + 8;
    }
    else {
      puVar3 = *(uint **)(puVar5 + 2);
      *(uint **)(puVar5 + 2) = puVar3 + 2;
    }
    uVar4 = (ulong)*puVar3;
    if (*puVar3 == 0xffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,'m');
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string vformat_color_escape(TerminalFormat color, va_list va) {
  string fmt("\033");

  do {
    fmt += (fmt[fmt.size() - 1] == '\033') ? '[' : ';';
    fmt += to_string((int)color);
    color = va_arg(va, TerminalFormat);
  } while (color != TerminalFormat::END);

  fmt += 'm';
  return fmt;
}